

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Term.cpp
# Opt level: O2

Term * Kernel::Term::create(uint function,uint arity,TermList *args)

{
  int *piVar1;
  uint *puVar2;
  Cell *pCVar3;
  uint64_t *puVar4;
  TermSharing *this;
  bool bVar5;
  type tVar6;
  uint uVar7;
  Term *pTVar8;
  Cell *pCVar9;
  TermList *pTVar10;
  ulong uVar11;
  Cell *pCVar12;
  int iVar13;
  long lVar14;
  uint arity_local;
  uint function_local;
  TermList *args_local;
  anon_class_24_3_c9ea936b allocTerm;
  anon_class_24_3_c9ea936b local_48;
  
  lVar14 = 0;
  arity_local = arity;
  function_local = function;
  args_local = args;
  do {
    this = DAT_00a14198;
    if (arity <= (uint)lVar14) {
      allocTerm.arity = &arity_local;
      allocTerm.function = &function_local;
      allocTerm.args = &args_local;
      tVar6 = Lib::DefaultHash::hash<unsigned_int>(function,0x811c9dc5);
      for (uVar11 = 0; arity != uVar11; uVar11 = uVar11 + 1) {
        local_48.arity = (uint *)args_local[uVar11]._content;
        uVar7 = Lib::DefaultHash::hashBytes((uchar *)&local_48,8,0x811c9dc5);
        tVar6 = (uVar7 ^ tVar6) * 0x1000193;
      }
      local_48.args = allocTerm.args;
      uVar11 = 2;
      if (2 < tVar6) {
        uVar11 = (ulong)tVar6;
      }
      local_48.arity = allocTerm.arity;
      local_48.function = allocTerm.function;
      if ((this->_terms)._maxEntries <= (this->_terms)._nonemptyCells) {
        Lib::Set<Kernel::Term_*,_Indexing::TermSharing>::expand(&this->_terms);
      }
      pCVar3 = (this->_terms)._entries;
      pCVar12 = (Cell *)0x0;
      pCVar9 = pCVar3 + uVar11 % (ulong)(uint)(this->_terms)._capacity;
      do {
        uVar7 = pCVar9->code;
        if (uVar7 == 0) {
          if (pCVar12 == (Cell *)0x0) {
            piVar1 = &(this->_terms)._nonemptyCells;
            *piVar1 = *piVar1 + 1;
            pCVar12 = pCVar9;
          }
          puVar2 = &(this->_terms)._size;
          *puVar2 = *puVar2 + 1;
          pTVar8 = create::anon_class_24_3_c9ea936b::operator()(&local_48);
          pCVar12->value = pTVar8;
          pCVar12->code = (uint)uVar11;
          pTVar8 = pCVar12->value;
          Indexing::TermSharing::computeAndSetSharedTermData(DAT_00a14198,pTVar8);
          return pTVar8;
        }
        if (uVar7 == 1) {
          if (pCVar12 == (Cell *)0x0) {
            pCVar12 = pCVar9;
          }
        }
        else if ((uVar7 == (uint)uVar11) &&
                (pTVar8 = pCVar9->value, pTVar8->_functor == function_local)) {
          lVar14 = 0;
          pTVar10 = args_local;
          do {
            if (-lVar14 == (ulong)arity_local) {
              return pCVar9->value;
            }
            iVar13 = (int)lVar14;
            puVar4 = &pTVar10->_content;
            lVar14 = lVar14 + -1;
            pTVar10 = pTVar10 + 1;
          } while (*puVar4 ==
                   pTVar8->_args[(int)((*(uint *)&pTVar8->field_0xc & 0xfffffff) + iVar13)]._content
                  );
        }
        pCVar9 = pCVar9 + 1;
        if (pCVar9 == (this->_terms)._afterLast) {
          pCVar9 = pCVar3;
        }
      } while( true );
    }
    pTVar10 = args + lVar14;
    lVar14 = lVar14 + 1;
    bVar5 = argSafeToShare((TermList)pTVar10->_content);
  } while (bVar5);
  allocTerm.arity = &arity_local;
  allocTerm.function = &function_local;
  allocTerm.args = &args_local;
  pTVar8 = create::anon_class_24_3_c9ea936b::operator()(&allocTerm);
  return pTVar8;
}

Assistant:

Term* Term::create(unsigned function, unsigned arity, const TermList* args)
{
  ASS_EQ(env.signature->functionArity(function), arity);

  bool share = range(0, arity).all([&](auto i) { return argSafeToShare(args[i]); });

  auto allocTerm = [&]() {
    Term* s = new(arity) Term;
    s->makeSymbol(function,arity);
    for (auto i : range(0, arity)) {
      *s->nthArgument(i) = args[i];
    }
    return s;
  };

  if (share) {
    bool created = false;
    auto shared =
      env.sharing->_terms.rawFindOrInsert(allocTerm,
        Term::termHash(function, [&](auto i){ return args[i]; }, arity),
        [&](Term* t) { return t->functor() == function && range(0, arity).all([&](auto i) { return args[i] == *t->nthArgument(i); }); },
        created);
    if (created) {
      env.sharing->computeAndSetSharedTermData(shared);
    }
    return shared;
  } else {
    return allocTerm();
  }
}